

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O3

HeapTypeGenerator *
wasm::HeapTypeGenerator::create
          (HeapTypeGenerator *__return_storage_ptr__,Random *rand,FeatureSet features,size_t n)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  __index_type _Var2;
  pointer pvVar3;
  Field *pFVar4;
  void *pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer puVar8;
  pointer puVar9;
  pointer pTVar10;
  uintptr_t *puVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  _Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
  *p_Var15;
  pointer pvVar16;
  size_type sVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  Type TVar21;
  ulong uVar22;
  long *plVar23;
  Type TVar24;
  ulong uVar25;
  pointer pvVar26;
  Shareability SVar27;
  uint uVar28;
  const_iterator __end2;
  pointer pvVar29;
  HeapType HVar30;
  undefined1 auVar31 [8];
  int iVar32;
  size_t __n;
  iterator iVar33;
  char *pcVar34;
  Index j;
  _Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
  _Var35;
  uint uVar36;
  const_iterator __begin2;
  long lVar37;
  Field *pFVar38;
  undefined1 auVar39 [16];
  Field FVar40;
  Signature SVar41;
  Array AVar42;
  Array AVar43;
  Signature SVar44;
  Field local_1d8;
  undefined1 local_1c0 [112];
  __node_base_ptr *local_150;
  size_type local_148;
  __node_base local_140;
  size_type sStack_138;
  float local_130;
  size_t local_128;
  __node_base_ptr p_Stack_120;
  pointer local_118;
  pointer pvStack_110;
  pointer local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_100;
  uint local_e8;
  FuzzParams local_e0;
  undefined8 local_98;
  HeapType supertype;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_60;
  undefined1 auStack_48 [8];
  Index newGroupStart;
  Mutability MStack_3c;
  Field *local_38;
  
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)local_1c0,n);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)(local_1c0 + 8),n,(allocator_type *)auStack_48);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::vector
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             (local_1c0 + 0x20),n,(allocator_type *)&local_60);
  local_1c0._56_8_ = (TypeBuilder *)local_1c0;
  local_1c0._64_8_ =
       (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        *)(local_1c0 + 8);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::vector
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             (local_1c0 + 0x48),n,(allocator_type *)auStack_48);
  local_150 = &p_Stack_120;
  local_148 = 1;
  local_140._M_nxt = (_Hash_node_base *)0x0;
  sStack_138 = 0;
  local_130 = 1.0;
  local_e0.USABLE_MEMORY.addr = 0;
  local_128 = 0;
  p_Stack_120 = (__node_base_ptr)0x0;
  local_118 = (pointer)0x0;
  pvStack_110 = (pointer)0x0;
  local_108 = (pointer)0x0;
  vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_e8 = 0;
  local_1c0._96_8_ = rand;
  local_1c0._104_4_ = features.features;
  FuzzParams::setDefaults(&local_e0);
  p_Var15 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             *)wasm::TypeBuilder::size();
  pvVar7 = pvStack_110;
  pvVar6 = local_118;
  if ((ulong)p_Var15 >> 0x3e != 0) {
    std::__throw_length_error("vector::reserve");
  }
  if ((_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
       *)((long)local_108 - (long)local_118 >> 1) < p_Var15) {
    pvVar16 = std::
              _Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
              ::_M_allocate(p_Var15,n);
    pvVar29 = pvVar16;
    for (pvVar26 = local_118; pvVar26 != pvStack_110; pvVar26 = pvVar26 + 1) {
      (pvVar29->
      super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      ).
      super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      .
      super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      .
      super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      .
      super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      .
      super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
           = (pvVar26->
             super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             ).
             super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      ;
      pvVar29 = pvVar29 + 1;
    }
    if (local_118 != (pointer)0x0) {
      operator_delete(local_118,(long)local_108 - (long)local_118);
    }
    pvStack_110 = (pointer)(((long)pvVar7 - (long)pvVar6) + (long)pvVar16);
    local_108 = pvVar16 + (long)p_Var15;
    local_118 = pvVar16;
  }
  sVar17 = wasm::TypeBuilder::size();
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::reserve
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             (local_1c0 + 0x48),sVar17);
  uVar12 = wasm::TypeBuilder::size();
  uVar12 = Random::upTo(rand,uVar12);
  SVar27 = Shared;
  while (local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_ = SVar27, uVar18 = wasm::TypeBuilder::size(),
        SVar27 < uVar18) {
    uVar19 = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
    newGroupStart =
         (Shareability)
         local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_start;
    auStack_48 = (undefined1  [8])uVar19;
    std::
    _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
              ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_150,auStack_48);
    pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_1c0._64_8_)->_M_impl).super__Vector_impl_data._M_start +
             (Shareability)
             local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start);
    iVar33._M_current = *(uint **)(pvVar1 + 8);
    if (iVar33._M_current == *(uint **)(pvVar1 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar1,iVar33,(uint *)&local_60);
    }
    else {
      *iVar33._M_current =
           (Shareability)
           local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(uint **)(pvVar1 + 8) = iVar33._M_current + 1;
    }
    if (((Shareability)
         local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_start < uVar12 + Unshared) ||
       (uVar13 = Random::upTo(rand,2), uVar13 == 0)) {
      __n = 3;
      uVar13 = Random::upTo((Random *)local_1c0._96_8_,3);
      pvVar7 = pvStack_110;
      pvVar6 = local_118;
      if (2 < uVar13) {
        wasm::handle_unreachable
                  ("unexpected index",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                   ,0x284);
      }
      _Var35 = SUB42(uVar13 << 8,0);
      if (pvStack_110 == local_108) {
        lVar37 = (long)pvStack_110 - (long)local_118;
        if (lVar37 == 0x7ffffffffffffffe) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar25 = lVar37 >> 1;
        uVar18 = uVar25;
        if (pvStack_110 == local_118) {
          uVar18 = 1;
        }
        p_Var15 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                   *)(uVar18 + uVar25);
        if ((_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             *)0x3ffffffffffffffe < p_Var15) {
          p_Var15 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                     *)0x3fffffffffffffff;
        }
        if (CARRY8(uVar18,uVar25)) {
          p_Var15 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                     *)0x3fffffffffffffff;
        }
        pvVar16 = std::
                  _Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                  ::_M_allocate(p_Var15,__n);
        *(_Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          *)((long)pvVar16 + lVar37) = _Var35;
        pvVar29 = pvVar16;
        for (pvVar26 = pvVar6; pvVar7 != pvVar26; pvVar26 = pvVar26 + 1) {
          (pvVar29->
          super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          ).
          super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          .
          super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          .
          super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          .
          super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          .
          super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               = (pvVar26->
                 super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 ).
                 super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 .
                 super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 .
                 super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 .
                 super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 .
                 super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          ;
          pvVar29 = pvVar29 + 1;
        }
        if (pvVar6 != (pointer)0x0) {
          operator_delete(pvVar6,(long)local_108 - (long)pvVar6);
        }
        local_108 = pvVar16 + (long)p_Var15;
        local_118 = pvVar16;
      }
      else {
        (pvStack_110->
        super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ).
        super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             = _Var35;
        pvVar29 = pvStack_110;
      }
      SVar27 = (Shareability)
               local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = local_1c0._56_8_;
      pvStack_110 = pvVar29 + 1;
      if ((features.features >> 0x11 & 1) != 0) {
        Random::upTo(rand,2);
      }
      wasm::TypeBuilder::setShared(uVar19,SVar27);
    }
    else {
      uVar13 = Random::upTo(rand,(Shareability)
                                 local_60.
                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      SVar27 = (Shareability)
               local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = local_1c0._56_8_;
      uVar18 = (ulong)uVar13;
      uVar20 = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
      wasm::TypeBuilder::setSubType(uVar19,SVar27,uVar20,1);
      SVar27 = (Shareability)
               local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = local_1c0._56_8_;
      TVar21.id = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
      auStack_48 = (undefined1  [8])TVar21.id;
      wasm::HeapType::getShared();
      wasm::TypeBuilder::setShared(uVar19,SVar27);
      (((pointer)
       (local_1c0._72_8_ +
       (ulong)(Shareability)
              local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
              super__Vector_impl_data._M_start * 8))->super__Optional_base<unsigned_int,_true,_true>
      )._M_payload.super__Optional_payload_base<unsigned_int> =
           (_Optional_payload_base<unsigned_int>)(uVar18 | 0x100000000);
      pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
               ((((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)local_1c0._64_8_)->_M_impl).super__Vector_impl_data._M_start + uVar18);
      iVar33._M_current = *(uint **)(pvVar1 + 8);
      if (iVar33._M_current == *(uint **)(pvVar1 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar33,(uint *)&local_60);
      }
      else {
        *iVar33._M_current =
             (Shareability)
             local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
        iVar33._M_current = iVar33._M_current + 1;
        *(uint **)(pvVar1 + 8) = iVar33._M_current;
      }
      pvVar7 = pvStack_110;
      pvVar6 = local_118;
      if (pvStack_110 == local_108) {
        lVar37 = (long)pvStack_110 - (long)local_118;
        if (lVar37 == 0x7ffffffffffffffe) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar22 = lVar37 >> 1;
        uVar25 = uVar22;
        if (pvStack_110 == local_118) {
          uVar25 = 1;
        }
        p_Var15 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                   *)(uVar25 + uVar22);
        if ((_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             *)0x3ffffffffffffffe < p_Var15) {
          p_Var15 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                     *)0x3fffffffffffffff;
        }
        if (CARRY8(uVar25,uVar22)) {
          p_Var15 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                     *)0x3fffffffffffffff;
        }
        pvVar16 = std::
                  _Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                  ::_M_allocate(p_Var15,(size_t)iVar33._M_current);
        *(_Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          *)((long)pvVar16 + lVar37) =
             pvVar6[uVar18].
             super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ;
        pvVar29 = pvVar16 + 1;
        pvVar26 = pvVar6;
        if (pvVar7 == pvVar6) {
LAB_0018fb65:
          operator_delete(pvVar6,(long)local_108 - (long)pvVar6);
        }
        else {
          do {
            pvVar29[-1].
            super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 = (pvVar26->
                   super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   ).
                   super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            ;
            pvVar26 = pvVar26 + 1;
            pvVar29 = pvVar29 + 1;
          } while (pvVar26 != pvVar7);
          if (pvVar6 != (pointer)0x0) goto LAB_0018fb65;
        }
        local_108 = pvVar16 + (long)p_Var15;
        local_118 = pvVar16;
        pvStack_110 = pvVar29;
      }
      else {
        (pvStack_110->
        super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ).
        super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             = local_118[uVar18].
               super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ;
        pvStack_110 = pvStack_110 + 1;
      }
    }
    SVar27 = (Shareability)
             local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start + Unshared;
  }
  uVar28 = 0;
  while( true ) {
    uVar18 = wasm::TypeBuilder::size();
    uVar19 = local_1c0._56_8_;
    uVar25 = (ulong)uVar28;
    if (uVar18 <= uVar25) break;
    pvVar3 = (((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_1c0._64_8_)->_M_impl).super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar3[uVar25].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar3[uVar25].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data) < 5) {
      Random::upTo(rand,2);
    }
    wasm::TypeBuilder::setOpen(uVar19,SUB41(uVar28,0));
    uVar28 = uVar28 + 1;
  }
  sVar17 = wasm::TypeBuilder::size();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&vStack_100,sVar17);
  uVar12 = wasm::TypeBuilder::size();
  uVar12 = Random::upTo(rand,uVar12);
  uVar18 = 0;
  uVar28 = 0;
  while( true ) {
    uVar36 = uVar28 + 1;
    uVar25 = wasm::TypeBuilder::size();
    puVar9 = vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar8 = vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar25 <= uVar28) break;
    lVar37 = wasm::TypeBuilder::size();
    if ((lVar37 - 1U == (ulong)uVar28) ||
       (uVar13 = Random::upTo(rand,uVar12 + 1), uVar28 = uVar36, uVar13 == 0)) {
      auStack_48._0_4_ = uVar36;
      wasm::TypeBuilder::createRecGroup(local_1c0._56_8_,uVar18);
      while( true ) {
        if ((uint)auStack_48._0_4_ <= (uint)uVar18) break;
        if (vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&vStack_100,
                     (iterator)
                     vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)auStack_48);
        }
        else {
          *vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = auStack_48._0_4_;
          vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar18 = (ulong)((uint)uVar18 + 1);
      }
      uVar18 = (ulong)(uint)auStack_48._0_4_;
      uVar28 = uVar36;
    }
  }
  lVar37 = wasm::TypeBuilder::size();
  if ((long)puVar9 - (long)puVar8 >> 2 != lVar37) {
    __assert_fail("recGroupEnds.size() == builder.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x74,
                  "wasm::(anonymous namespace)::HeapTypeGeneratorImpl::HeapTypeGeneratorImpl(Random &, FeatureSet, size_t)"
                 );
  }
  do {
    uVar28 = local_e8;
    uVar18 = wasm::TypeBuilder::size();
    if (uVar18 <= uVar28) {
      wasm::TypeBuilder::TypeBuilder(&__return_storage_ptr__->builder,(TypeBuilder *)local_1c0);
      (__return_storage_ptr__->subtypeIndices).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c0._8_8_;
      (__return_storage_ptr__->subtypeIndices).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c0._16_8_;
      (__return_storage_ptr__->subtypeIndices).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c0._24_8_;
      local_1c0._24_8_ = (pointer)0x0;
      local_1c0._8_8_ = (pointer)0x0;
      local_1c0._16_8_ = (pointer)0x0;
      (__return_storage_ptr__->supertypeIndices).
      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c0._32_8_;
      (__return_storage_ptr__->supertypeIndices).
      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c0._40_8_;
      (__return_storage_ptr__->supertypeIndices).
      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c0._48_8_;
      local_1c0._48_8_ = (pointer)0x0;
      local_1c0._32_8_ = (pointer)0x0;
      local_1c0._40_8_ = (pointer)0x0;
      anon_unknown_24::HeapTypeGeneratorImpl::~HeapTypeGeneratorImpl
                ((HeapTypeGeneratorImpl *)local_1c0);
      return __return_storage_ptr__;
    }
    _Var2 = local_118[local_e8].
            super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            ._M_index;
    TVar21.id = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
    auStack_48 = (undefined1  [8])TVar21.id;
    SVar27 = wasm::HeapType::getShared();
    uVar19 = local_1c0._96_8_;
    if ((((pointer)(local_1c0._72_8_ + (ulong)local_e8 * 8))->
        super__Optional_base<unsigned_int,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      if (_Var2 == '\x02') {
        _auStack_48 = anon_unknown_24::HeapTypeGeneratorImpl::generateField
                                ((HeapTypeGeneratorImpl *)local_1c0,SVar27);
        AVar42.element.type.id._4_4_ = 0;
        AVar42.element.type.id._0_4_ = local_e8;
        AVar42.element._8_8_ = (allocator_type *)auStack_48;
        wasm::TypeBuilder::setHeapType(local_1c0._56_8_,AVar42);
      }
      else {
        if (_Var2 == '\x01') {
          uVar12 = Random::upTo((Random *)local_1c0._96_8_,local_e0.MAX_STRUCT_SIZE + 1);
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48,(ulong)uVar12,
                     (allocator_type *)&supertype);
          pFVar38 = _newGroupStart;
          for (auVar31 = auStack_48; auVar31 != (undefined1  [8])pFVar38;
              auVar31 = (undefined1  [8])((long)auVar31 + 0x10)) {
            FVar40 = anon_unknown_24::HeapTypeGeneratorImpl::generateField
                               ((HeapTypeGeneratorImpl *)local_1c0,SVar27);
            *(Field *)auVar31 = FVar40;
          }
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    (&local_60,(vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48);
          if (auStack_48 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_48,(long)local_38 - (long)auStack_48);
          }
          wasm::TypeBuilder::setHeapType(local_1c0._56_8_,(Struct *)(ulong)local_e8);
          goto LAB_00190125;
        }
        if (_Var2 != '\0') {
          wasm::handle_unreachable
                    ("unexpected kind",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                     ,0x83);
        }
        uVar12 = Random::upTo((Random *)local_1c0._96_8_,local_e0.MAX_PARAMS);
        uVar12 = Random::upTo((Random *)uVar19,uVar12);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&supertype,(ulong)uVar12,
                   (allocator_type *)auStack_48);
        pTVar10 = types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (HVar30.id = supertype.id; (pointer)HVar30.id != pTVar10; HVar30.id = HVar30.id + 8) {
          TVar21 = anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
                             ((HeapTypeGeneratorImpl *)local_1c0,Unshared);
          ((pointer)HVar30.id)->id = TVar21.id;
        }
        TVar21.id = wasm::TypeBuilder::getTempTupleType((vector *)local_1c0._56_8_);
        uVar12 = Random::upTo((Random *)local_1c0._96_8_,6);
        if (uVar12 != 0) {
          if (((local_1c0._104_4_ & 0x200) == 0) ||
             (uVar12 = Random::upTo((Random *)local_1c0._96_8_,5), uVar12 != 0)) {
            anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
                      ((HeapTypeGeneratorImpl *)local_1c0,Unshared);
          }
          else {
            uVar12 = Random::upTo((Random *)local_1c0._96_8_,local_e0.MAX_TUPLE_SIZE - 1);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
                       (ulong)(uVar12 + 2),(allocator_type *)&local_60);
            puVar11 = (uintptr_t *)_newGroupStart;
            for (auVar31 = auStack_48; uVar19 = local_1c0._56_8_,
                auVar31 != (undefined1  [8])puVar11; auVar31 = (undefined1  [8])((long)auVar31 + 8))
            {
              TVar24 = anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
                                 ((HeapTypeGeneratorImpl *)local_1c0,Unshared);
              *(uintptr_t *)auVar31 = TVar24.id;
            }
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_60,
                       (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48);
            wasm::TypeBuilder::getTempTupleType((vector *)uVar19);
            pvVar5 = (void *)CONCAT44(local_60.
                                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (Shareability)
                                      local_60.
                                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
            if (pvVar5 != (void *)0x0) {
              operator_delete(pvVar5,(long)local_60.
                                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar5);
            }
            if (auStack_48 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_48,(long)local_38 - (long)auStack_48);
            }
          }
        }
        if (supertype.id != 0) {
          operator_delete((void *)supertype.id,
                          (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                _M_impl.super__Vector_impl_data._M_finish - supertype.id);
        }
        SVar44.params.id._4_4_ = 0;
        SVar44.params.id._0_4_ = local_e8;
        SVar44.results.id = TVar21.id;
        wasm::TypeBuilder::setHeapType(local_1c0._56_8_,SVar44);
      }
      goto switchD_0018fda5_default;
    }
    local_98 = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
    uVar14 = wasm::HeapType::getKind();
    switch(uVar14) {
    case 0:
      uVar28 = 0x95;
      pcVar34 = "unexpected kind";
      goto LAB_001902bb;
    case 1:
      auVar39 = wasm::HeapType::getSignature();
      TVar21 = anon_unknown_24::HeapTypeGeneratorImpl::generateSupertype
                         ((HeapTypeGeneratorImpl *)local_1c0,auVar39._0_8_);
      anon_unknown_24::HeapTypeGeneratorImpl::generateSubtype
                ((HeapTypeGeneratorImpl *)local_1c0,(Type)auVar39._8_8_);
      SVar41.params.id._4_4_ = 0;
      SVar41.params.id._0_4_ = local_e8;
      SVar41.results.id = TVar21.id;
      wasm::TypeBuilder::setHeapType(local_1c0._56_8_,SVar41);
      break;
    case 2:
      plVar23 = (long *)wasm::HeapType::getStruct();
      pFVar38 = (Field *)*plVar23;
      pFVar4 = (Field *)plVar23[1];
      _auStack_48 = (Field)ZEXT816(0);
      local_38 = (Field *)0x0;
      if (pFVar38 == pFVar4) {
        iVar32 = 1;
      }
      else {
        do {
          _supertype = anon_unknown_24::HeapTypeGeneratorImpl::generateSubField
                                 ((HeapTypeGeneratorImpl *)local_1c0,*pFVar38);
          if (_newGroupStart == local_38) {
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::_M_realloc_insert<wasm::Field>
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48,
                       _newGroupStart,(Field *)&supertype);
          }
          else {
            (_newGroupStart->type).id = supertype.id;
            *(pointer *)&_newGroupStart->packedType =
                 types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
            _newGroupStart = _newGroupStart + 1;
          }
          pFVar38 = pFVar38 + 1;
        } while (pFVar38 != pFVar4);
        iVar32 = 1 - (int)((ulong)((long)_newGroupStart - (long)auStack_48) >> 4);
      }
      for (uVar12 = Random::upTo((Random *)local_1c0._96_8_,iVar32 + local_e0.MAX_STRUCT_SIZE);
          uVar12 != 0; uVar12 = uVar12 - 1) {
        _supertype = anon_unknown_24::HeapTypeGeneratorImpl::generateField
                               ((HeapTypeGeneratorImpl *)local_1c0,SVar27);
        if (_newGroupStart == local_38) {
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::_M_realloc_insert<wasm::Field>
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48,_newGroupStart,
                     (Field *)&supertype);
        }
        else {
          (_newGroupStart->type).id = supertype.id;
          *(pointer *)&_newGroupStart->packedType =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
          _newGroupStart = _newGroupStart + 1;
        }
      }
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                (&local_60,(vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48);
      if (auStack_48 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_48,(long)local_38 - (long)auStack_48);
      }
      wasm::TypeBuilder::setHeapType(local_1c0._56_8_,(Struct *)(ulong)local_e8);
LAB_00190125:
      pvVar5 = (void *)CONCAT44(local_60.
                                super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (Shareability)
                                local_60.
                                super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_60.
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar5);
      }
      break;
    case 3:
      wasm::HeapType::getArray();
      _auStack_48 = anon_unknown_24::HeapTypeGeneratorImpl::generateSubField
                              ((HeapTypeGeneratorImpl *)local_1c0,local_1d8);
      AVar43.element.type.id._4_4_ = 0;
      AVar43.element.type.id._0_4_ = local_e8;
      AVar43.element._8_8_ = (allocator_type *)auStack_48;
      wasm::TypeBuilder::setHeapType(local_1c0._56_8_,AVar43);
      break;
    case 4:
      uVar28 = 0x93;
      pcVar34 = "TODO: cont";
LAB_001902bb:
      wasm::handle_unreachable
                (pcVar34,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,uVar28);
    }
switchD_0018fda5_default:
    local_e8 = local_e8 + 1;
  } while( true );
}

Assistant:

HeapTypeGenerator
HeapTypeGenerator::create(Random& rand, FeatureSet features, size_t n) {
  return HeapTypeGeneratorImpl(rand, features, n).result;
}